

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  undefined8 *puVar1;
  stbi__uint32 b_00;
  stbi__context *s;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  void *pvVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int *piVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int local_74;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar2 = stbi__get_marker(z);
  if (sVar2 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  bVar3 = stbi__get_marker(z);
  while ((bVar3 != 0xc2 && ((bVar3 & 0xfe) != 0xc0))) {
    iVar4 = stbi__process_marker(z,(uint)bVar3);
    if (iVar4 == 0) {
      return 0;
    }
    while (bVar3 = stbi__get_marker(z), bVar3 == 0xff) {
      iVar4 = stbi__at_eof(z->s);
      if (iVar4 != 0) {
        stbi__g_failure_reason = "no SOF";
        return 0;
      }
    }
  }
  z->progressive = (uint)(bVar3 == 0xc2);
  s = z->s;
  uVar5 = stbi__get16be(s);
  if (10 < uVar5) {
    sVar2 = stbi__get8(s);
    if (sVar2 != '\b') {
      stbi__g_failure_reason = "only 8-bit";
      return 0;
    }
    sVar6 = stbi__get16be(s);
    s->img_y = sVar6;
    if (sVar6 == 0) {
      stbi__g_failure_reason = "no header height";
      return 0;
    }
    sVar6 = stbi__get16be(s);
    s->img_x = sVar6;
    if (sVar6 == 0) {
      stbi__g_failure_reason = "0 width";
      return 0;
    }
    if (0x1000000 < s->img_y) {
      stbi__g_failure_reason = "too large";
      return 0;
    }
    bVar3 = stbi__get8(s);
    if ((4 < bVar3) || ((0x1aU >> (bVar3 & 0x1f) & 1) == 0)) {
      stbi__g_failure_reason = "bad component count";
      return 0;
    }
    s->img_n = (uint)bVar3;
    for (lVar9 = 0; (ulong)bVar3 * 0x60 - lVar9 != 0; lVar9 = lVar9 + 0x60) {
      *(undefined8 *)((long)&z->img_comp[0].data + lVar9) = 0;
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar9) = 0;
    }
    if (uVar5 == (uint)bVar3 + (uint)bVar3 * 2 + 8) {
      z->rgb = 0;
      piVar14 = &z->img_comp[0].tq;
      lVar9 = 0;
      while (uVar5 = s->img_n, lVar9 < (int)uVar5) {
        bVar3 = stbi__get8(s);
        ((anon_struct_96_18_0d0905d3 *)(piVar14 + -3))->id = (uint)bVar3;
        if ((s->img_n == 3) &&
           (bVar3 == *(byte *)((long)&stbi__process_frame_header(stbi__jpeg*,int)::rgb + lVar9))) {
          z->rgb = z->rgb + 1;
        }
        bVar3 = stbi__get8(s);
        piVar14[-2] = (uint)(bVar3 >> 4);
        if ((byte)(bVar3 + 0xb0) < 0xc0) {
          stbi__g_failure_reason = "bad H";
          return 0;
        }
        piVar14[-1] = bVar3 & 0xf;
        if ((bVar3 & 0xf) - 5 < 0xfffffffc) {
          stbi__g_failure_reason = "bad V";
          return 0;
        }
        bVar3 = stbi__get8(s);
        *piVar14 = (uint)bVar3;
        lVar9 = lVar9 + 1;
        piVar14 = piVar14 + 0x18;
        if (3 < bVar3) {
          stbi__g_failure_reason = "bad TQ";
          return 0;
        }
      }
      if (scan != 0) {
        return 1;
      }
      sVar6 = s->img_x;
      b_00 = s->img_y;
      uVar15 = 0;
      iVar4 = stbi__mad3sizes_valid(sVar6,b_00,uVar5,0);
      if (iVar4 == 0) {
        stbi__g_failure_reason = "too large";
        return 0;
      }
      uVar17 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar17 = uVar15;
      }
      uVar10 = 1;
      uVar12 = 1;
      while( true ) {
        iVar4 = (int)uVar10;
        iVar11 = (int)uVar12;
        if (uVar17 * 0x60 - uVar15 == 0) break;
        uVar5 = *(uint *)((long)&z->img_comp[0].h + uVar15);
        uVar7 = *(uint *)((long)&z->img_comp[0].v + uVar15);
        if (iVar4 < (int)uVar5) {
          uVar10 = (ulong)uVar5;
        }
        if (iVar11 < (int)uVar7) {
          uVar12 = (ulong)uVar7;
        }
        uVar15 = uVar15 + 0x60;
      }
      z->img_h_max = iVar4;
      z->img_v_max = iVar11;
      z->img_mcu_w = iVar4 * 8;
      z->img_mcu_h = iVar11 * 8;
      lVar9 = 0;
      uVar5 = ((sVar6 + iVar4 * 8) - 1) / (uint)(iVar4 * 8);
      z->img_mcu_x = uVar5;
      uVar7 = ((b_00 + iVar11 * 8) - 1) / (uint)(iVar11 * 8);
      z->img_mcu_y = uVar7;
      local_74 = 1;
      while( true ) {
        if (uVar17 * 0x60 == lVar9) {
          return 1;
        }
        iVar16 = *(int *)((long)&z->img_comp[0].h + lVar9);
        iVar13 = *(int *)((long)&z->img_comp[0].v + lVar9);
        *(int *)((long)&z->img_comp[0].x + lVar9) = (int)((iVar16 * sVar6 + iVar4 + -1) / uVar10);
        *(int *)((long)&z->img_comp[0].y + lVar9) = (int)((iVar13 * b_00 + iVar11 + -1) / uVar12);
        iVar16 = iVar16 * uVar5;
        a = iVar16 * 8;
        *(int *)((long)&z->img_comp[0].w2 + lVar9) = a;
        iVar13 = iVar13 * uVar7;
        b = iVar13 * 8;
        *(int *)((long)&z->img_comp[0].h2 + lVar9) = b;
        pvVar8 = stbi__malloc_mad2(a,b,0xf);
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar9) = 0;
        puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar9);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(void **)((long)&z->img_comp[0].raw_data + lVar9) = pvVar8;
        why = extraout_EDX;
        if (pvVar8 == (void *)0x0) break;
        *(ulong *)((long)&z->img_comp[0].data + lVar9) = (long)pvVar8 + 0xfU & 0xfffffffffffffff0;
        if (z->progressive != 0) {
          *(int *)((long)&z->img_comp[0].coeff_w + lVar9) = iVar16;
          *(int *)((long)&z->img_comp[0].coeff_h + lVar9) = iVar13;
          pvVar8 = stbi__malloc_mad3(a,b,2,0xf);
          *(void **)((long)&z->img_comp[0].raw_coeff + lVar9) = pvVar8;
          why = extraout_EDX_00;
          if (pvVar8 == (void *)0x0) break;
          *(ulong *)((long)&z->img_comp[0].coeff + lVar9) = (long)pvVar8 + 0xfU & 0xfffffffffffffff0
          ;
        }
        local_74 = local_74 + 1;
        lVar9 = lVar9 + 0x60;
      }
      stbi__g_failure_reason = "outofmem";
      stbi__free_jpeg_components(z,local_74,why);
      return 0;
    }
  }
  stbi__g_failure_reason = "bad SOF len";
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}